

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

void __thiscall mat_lib::vector<double>::vector(vector<double> *this,size_t maxSize)

{
  size_t i;
  ulong uVar1;
  element_t value;
  value_type_conflict local_28;
  
  this->max_size__ = maxSize;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->format__ = fixed;
  this->fractional_digits__ = 6;
  local_28 = 0.0;
  for (uVar1 = 0; uVar1 < maxSize; uVar1 = uVar1 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back(&this->container__,&local_28);
    maxSize = this->max_size__;
  }
  return;
}

Assistant:

vector(size_t maxSize) : max_size__(maxSize) {
          element_t value = 0;
          for(size_t i=0; i<max_size__; i++) container__.push_back(value);
      }